

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int updatewindow(z_streamp_conflict strm,uint out)

{
  internal_state *piVar1;
  uint uVar2;
  voidpf pvVar3;
  uint local_30;
  uint dist;
  uint copy;
  inflate_state *state;
  uint out_local;
  z_streamp_conflict strm_local;
  
  piVar1 = strm->state;
  if (*(long *)(piVar1 + 0x10) == 0) {
    pvVar3 = (*strm->zalloc)(strm->opaque,1 << ((byte)piVar1[0xc].dummy & 0x1f),1);
    *(voidpf *)(piVar1 + 0x10) = pvVar3;
    if (*(long *)(piVar1 + 0x10) == 0) {
      return 1;
    }
  }
  if (piVar1[0xd].dummy == 0) {
    piVar1[0xd].dummy = 1 << ((byte)piVar1[0xc].dummy & 0x1f);
    piVar1[0xf].dummy = 0;
    piVar1[0xe].dummy = 0;
  }
  uVar2 = out - strm->avail_out;
  if (uVar2 < (uint)piVar1[0xd].dummy) {
    local_30 = piVar1[0xd].dummy - piVar1[0xf].dummy;
    if (uVar2 < local_30) {
      local_30 = uVar2;
    }
    memcpy((void *)(*(long *)(piVar1 + 0x10) + (ulong)(uint)piVar1[0xf].dummy),
           strm->next_out + -(ulong)uVar2,(ulong)local_30);
    uVar2 = uVar2 - local_30;
    if (uVar2 == 0) {
      piVar1[0xf].dummy = local_30 + piVar1[0xf].dummy;
      if (piVar1[0xf].dummy == piVar1[0xd].dummy) {
        piVar1[0xf].dummy = 0;
      }
      if ((uint)piVar1[0xe].dummy < (uint)piVar1[0xd].dummy) {
        piVar1[0xe].dummy = local_30 + piVar1[0xe].dummy;
      }
    }
    else {
      memcpy(*(void **)(piVar1 + 0x10),strm->next_out + -(ulong)uVar2,(ulong)uVar2);
      piVar1[0xf].dummy = uVar2;
      piVar1[0xe].dummy = piVar1[0xd].dummy;
    }
  }
  else {
    memcpy(*(void **)(piVar1 + 0x10),strm->next_out + -(ulong)(uint)piVar1[0xd].dummy,
           (ulong)(uint)piVar1[0xd].dummy);
    piVar1[0xf].dummy = 0;
    piVar1[0xe].dummy = piVar1[0xd].dummy;
  }
  return 0;
}

Assistant:

local int updatewindow(z_streamp strm, unsigned out)
{
    struct inflate_state FAR *state;
    unsigned copy, dist;

    state = (struct inflate_state FAR *)strm->state;

    /* if it hasn't been done already, allocate space for the window */
    if (state->window == Z_NULL) {
        state->window = (unsigned char FAR *)
                        ZALLOC(strm, 1U << state->wbits,
                               sizeof(unsigned char));
        if (state->window == Z_NULL) return 1;
    }

    /* if window not in use yet, initialize */
    if (state->wsize == 0) {
        state->wsize = 1U << state->wbits;
        state->wnext = 0;
        state->whave = 0;
    }

    /* copy state->wsize or less output bytes into the circular window */
    copy = out - strm->avail_out;
    if (copy >= state->wsize) {
        zmemcpy(state->window, strm->next_out - state->wsize, state->wsize);
        state->wnext = 0;
        state->whave = state->wsize;
    }
    else {
        dist = state->wsize - state->wnext;
        if (dist > copy) dist = copy;
        zmemcpy(state->window + state->wnext, strm->next_out - copy, dist);
        copy -= dist;
        if (copy) {
            zmemcpy(state->window, strm->next_out - copy, copy);
            state->wnext = copy;
            state->whave = state->wsize;
        }
        else {
            state->wnext += dist;
            if (state->wnext == state->wsize) state->wnext = 0;
            if (state->whave < state->wsize) state->whave += dist;
        }
    }
    return 0;
}